

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_parse.cpp
# Opt level: O3

void __thiscall FParser::PointlessBrackets(FParser *this,int *start,int *stop)

{
  int iVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  
  lVar2 = (long)*start;
  if (*this->Tokens[lVar2] == '(') {
    iVar4 = *stop;
    while (*this->Tokens[iVar4] == ')') {
      iVar1 = (int)lVar2;
      if (iVar1 < iVar4) {
        lVar2 = 0;
        iVar3 = 0;
        do {
          if ((this->TokenType[iVar1 + lVar2] == operator_) &&
             (iVar3 = (iVar3 + (uint)(*this->Tokens[iVar1 + lVar2] == '(')) -
                      (uint)(*this->Tokens[iVar1 + lVar2] == ')'), iVar3 == 0)) {
            return;
          }
          lVar2 = lVar2 + 1;
        } while (iVar4 - iVar1 != (int)lVar2);
      }
      *start = iVar1 + 1;
      iVar4 = *stop + -1;
      *stop = iVar4;
      lVar2 = (long)*start;
      if (*this->Tokens[lVar2] != '(') {
        return;
      }
    }
  }
  return;
}

Assistant:

void FParser::PointlessBrackets(int *start, int *stop)
{
	int bracket_level, i;
	
	// check that the start and end are brackets
	
	while(Tokens[*start][0] == '(' && Tokens[*stop][0] == ')')
    {
		
		bracket_level = 0;
		
		// confirm there are pointless brackets..
		// if they are, bracket_level will only get to 0
		// at the last token
		// check up to <*stop rather than <=*stop to ignore
		// the last token
		
		for(i = *start; i<*stop; i++)
		{
			if(TokenType[i] != operator_) continue; // ops only
			bracket_level += (Tokens[i][0] == '(');
			bracket_level -= (Tokens[i][0] == ')');
			if(bracket_level == 0) return; // stop if braces stop before end
		}
		
		// move both brackets in
		
		*start = *start + 1;
		*stop = *stop - 1;
    }
}